

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O2

void __thiscall cursespp::ListOverlay::CustomListWindow::Reset(CustomListWindow *this)

{
  function<void_()> *__x;
  _Any_data local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  __x = std::function<void_()>::operator=(&this->adapterChanged,(function<void_()> *)&local_28);
  std::function<void_()>::operator=(&this->decorator,__x);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void Reset() {
            decorator = adapterChanged = Callback();
        }